

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Stat4ProbeSetValue
              (Parse *pParse,Index *pIdx,UnpackedRecord **ppRec,Expr *pExpr,int nElem,int iVal,
              int *pnExtract)

{
  u8 affinity;
  Expr *local_80;
  u8 aff;
  Expr *pElem;
  sqlite3_value *pVal;
  ValueNewStat4Ctx alloc;
  int local_38;
  int i;
  int nExtract;
  int rc;
  int iVal_local;
  int nElem_local;
  Expr *pExpr_local;
  UnpackedRecord **ppRec_local;
  Index *pIdx_local;
  Parse *pParse_local;
  
  i = 0;
  local_38 = 0;
  if ((pExpr == (Expr *)0x0) || (pExpr->op != 0x83)) {
    pVal = (sqlite3_value *)pParse;
    alloc.pParse = (Parse *)pIdx;
    alloc.pIdx = (Index *)ppRec;
    for (alloc._28_4_ = 0; (int)alloc._28_4_ < nElem; alloc._28_4_ = alloc._28_4_ + 1) {
      pElem = (Expr *)0x0;
      if (pExpr == (Expr *)0x0) {
        local_80 = (Expr *)0x0;
      }
      else {
        local_80 = sqlite3VectorFieldSubexpr(pExpr,alloc._28_4_);
      }
      affinity = sqlite3IndexColumnAffinity(pParse->db,pIdx,iVal + alloc._28_4_);
      alloc.ppRec._0_4_ = iVal + alloc._28_4_;
      i = stat4ValueFromExpr(pParse,local_80,affinity,(ValueNewStat4Ctx *)&pVal,
                             (sqlite3_value **)&pElem);
      if (pElem == (Expr *)0x0) break;
      local_38 = local_38 + 1;
    }
  }
  *pnExtract = local_38;
  return i;
}

Assistant:

SQLITE_PRIVATE int sqlite3Stat4ProbeSetValue(
  Parse *pParse,                  /* Parse context */
  Index *pIdx,                    /* Index being probed */
  UnpackedRecord **ppRec,         /* IN/OUT: Probe record */
  Expr *pExpr,                    /* The expression to extract a value from */
  int nElem,                      /* Maximum number of values to append */
  int iVal,                       /* Array element to populate */
  int *pnExtract                  /* OUT: Values appended to the record */
){
  int rc = SQLITE_OK;
  int nExtract = 0;

  if( pExpr==0 || pExpr->op!=TK_SELECT ){
    int i;
    struct ValueNewStat4Ctx alloc;

    alloc.pParse = pParse;
    alloc.pIdx = pIdx;
    alloc.ppRec = ppRec;

    for(i=0; i<nElem; i++){
      sqlite3_value *pVal = 0;
      Expr *pElem = (pExpr ? sqlite3VectorFieldSubexpr(pExpr, i) : 0);
      u8 aff = sqlite3IndexColumnAffinity(pParse->db, pIdx, iVal+i);
      alloc.iVal = iVal+i;
      rc = stat4ValueFromExpr(pParse, pElem, aff, &alloc, &pVal);
      if( !pVal ) break;
      nExtract++;
    }
  }

  *pnExtract = nExtract;
  return rc;
}